

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O1

ssize_t __thiscall
Intel::i8255::i8255<AmstradCPC::i8255PortHandler>::read
          (i8255<AmstradCPC::i8255PortHandler> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_RAX;
  undefined7 uVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar7;
  
  bVar1 = this->control_;
  uVar6 = (undefined7)((ulong)in_RAX >> 8);
  switch(__fd & 3) {
  case 0:
    if ((bVar1 & 0x10) != 0) {
      uVar3 = GI::AY38910::AY38910SampleSource<true>::get_data_output
                        (&(this->port_handler_->ay_->ay_).super_AY38910SampleSource<true>);
      return CONCAT71(extraout_var,uVar3);
    }
    bVar1 = this->outputs_[0];
    break;
  case 1:
    if ((bVar1 & 2) == 0) {
      return CONCAT71(uVar6,this->outputs_[1]);
    }
    bVar2 = (this->port_handler_->crtc_->bus_state_).vsync;
    bVar4 = Storage::Tape::BinaryTapePlayer::get_input(this->port_handler_->tape_player_);
    return CONCAT71(extraout_var_00,bVar4 << 7 | bVar2) | 0x7e;
  case 2:
    if ((bVar1 & 9) != 0) {
      uVar7 = 0xf;
      if ((bVar1 & 1) == 0) {
        uVar7 = (uint)(this->outputs_[2] & 0xf);
      }
      uVar5 = 0xf0;
      if ((bVar1 & 8) == 0) {
        uVar5 = (uint)(this->outputs_[2] & 0xf0);
      }
      return (ulong)(uVar5 | uVar7);
    }
    return CONCAT71(uVar6,this->outputs_[2]);
  }
  return CONCAT71(uVar6,bVar1);
}

Assistant:

uint8_t read(int address) {
			switch(address & 3) {
				case 0:	return (control_ & 0x10) ? port_handler_.get_value(0) : outputs_[0];
				case 1:	return (control_ & 0x02) ? port_handler_.get_value(1) : outputs_[1];
				case 2:	{
					if(!(control_ & 0x09)) return outputs_[2];
					uint8_t input = port_handler_.get_value(2);
					return ((control_ & 0x01) ? (input & 0x0f) : (outputs_[2] & 0x0f)) | ((control_ & 0x08) ? (input & 0xf0) : (outputs_[2] & 0xf0));
				}
				case 3:	return control_;
			}
			return 0xff;
		}